

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
insert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
          (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,size_t pos,
          unsigned_long *params)

{
  bool bVar1;
  size_t index;
  Entry *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  Entry *this_00;
  unsigned_long *in_R9;
  Maybe<unsigned_long> MVar3;
  size_t local_78;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:1530:22)>
  local_70;
  undefined1 local_50 [8];
  Iterator iter;
  unsigned_long *params_local;
  size_t pos_local;
  TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks> *this_local;
  ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table_local;
  
  this_local = (TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks> *)
               table.size_;
  this_00 = table.ptr;
  iter._16_8_ = in_R9;
  table_local.ptr = (Entry *)pos;
  table_local.size_ = (size_t)this;
  searchKey<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long>
            (&local_70,
             (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *)this_00,
             (ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)&this_local,in_R9
            );
  kj::_::BTreeImpl::insert
            ((Iterator *)local_50,(BTreeImpl *)&this_00->value,&local_70.super_SearchKey);
  bVar1 = kj::_::BTreeImpl::Iterator::isEnd((Iterator *)local_50);
  if (!bVar1) {
    index = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
    e = ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::operator[]
                  ((ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)&this_local
                   ,index);
    bVar1 = TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks::matches<unsigned_long&>
                      ((Callbacks *)this_00,e,(unsigned_long *)iter._16_8_);
    if (bVar1) {
      local_78 = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_78);
      aVar2 = extraout_RDX;
      goto LAB_005cb91c;
    }
  }
  kj::_::BTreeImpl::Iterator::insert((Iterator *)local_50,(BTreeImpl *)&this_00->value,(uint)params)
  ;
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  aVar2 = extraout_RDX_00;
LAB_005cb91c:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }